

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int attach_set_name(ATTACH_HANDLE attach,char *name_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ATTACH_INSTANCE *attach_instance;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0xfe6;
  }
  else {
    item_value = amqpvalue_create_string(name_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0xfee;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,0,item_value);
      iVar2 = 0xff4;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_name(ATTACH_HANDLE attach, const char* name_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE name_amqp_value = amqpvalue_create_string(name_value);
        if (name_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 0, name_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(name_amqp_value);
        }
    }

    return result;
}